

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

Curl_sh_entry * sh_addentry(Curl_hash *sh,curl_socket_t s)

{
  Curl_hash *h;
  void *pvVar1;
  Curl_sh_entry *check;
  Curl_sh_entry *there;
  Curl_hash *pCStack_18;
  curl_socket_t s_local;
  Curl_hash *sh_local;
  
  there._4_4_ = s;
  pCStack_18 = sh;
  sh_local = &sh_getentry(sh,s)->transfers;
  if ((Curl_sh_entry *)sh_local == (Curl_sh_entry *)0x0) {
    h = (Curl_hash *)(*Curl_ccalloc)(1,0x48);
    if (h == (Curl_hash *)0x0) {
      sh_local = (Curl_hash *)0x0;
    }
    else {
      Curl_hash_init(h,0xd,trhash,trhash_compare,trhash_dtor);
      pvVar1 = Curl_hash_add(pCStack_18,(void *)((long)&there + 4),4,h);
      sh_local = h;
      if (pvVar1 == (void *)0x0) {
        Curl_hash_destroy(h);
        (*Curl_cfree)(h);
        sh_local = (Curl_hash *)0x0;
      }
    }
  }
  return (Curl_sh_entry *)sh_local;
}

Assistant:

static struct Curl_sh_entry *sh_addentry(struct Curl_hash *sh,
                                         curl_socket_t s)
{
  struct Curl_sh_entry *there = sh_getentry(sh, s);
  struct Curl_sh_entry *check;

  if(there) {
    /* it is present, return fine */
    return there;
  }

  /* not present, add it */
  check = calloc(1, sizeof(struct Curl_sh_entry));
  if(!check)
    return NULL; /* major failure */

  Curl_hash_init(&check->transfers, TRHASH_SIZE, trhash, trhash_compare,
                 trhash_dtor);

  /* make/add new hash entry */
  if(!Curl_hash_add(sh, (char *)&s, sizeof(curl_socket_t), check)) {
    Curl_hash_destroy(&check->transfers);
    free(check);
    return NULL; /* major failure */
  }

  return check; /* things are good in sockhash land */
}